

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O0

BoolProperty * __thiscall lsim::BoolProperty::value_as_string_abi_cxx11_(BoolProperty *this)

{
  char *pcVar1;
  long in_RSI;
  allocator local_19 [9];
  BoolProperty *this_local;
  
  pcVar1 = "false";
  if ((*(byte *)(in_RSI + 0x28) & 1) != 0) {
    pcVar1 = "true";
  }
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return this;
}

Assistant:

std::string BoolProperty::value_as_string() const {
    return (m_value) ? "true" : "false";
}